

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O1

int graph_5_4::dfs_traverse(m_graph g)

{
  int iVar1;
  long lVar2;
  int v;
  int iVar3;
  undefined4 extraout_var;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  int in_stack_000001c0;
  undefined8 uStackY_1f8;
  undefined8 uStackY_1f0;
  m_graph in_stack_fffffffffffffe38;
  uint uStack_8;
  
  bVar12 = 0;
  if (0 < (long)in_stack_000001c0) {
    memset(&visited,0,(long)in_stack_000001c0 << 2);
  }
  piVar4 = &visited;
  iVar3 = 0;
  do {
    v = iVar3;
    iVar1 = *piVar4;
    piVar4 = piVar4 + 1;
    iVar3 = v + 1;
  } while (iVar1 != 0);
  puVar8 = (undefined8 *)&stack0x00000008;
  puVar9 = (undefined8 *)&stack0xfffffffffffffe38;
  for (lVar5 = 0x38; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar9 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
    puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
  }
  iVar3 = dfs(in_stack_fffffffffffffe38,v);
  uStackY_1f0 = CONCAT44(extraout_var,iVar3);
  uVar11 = (ulong)uStack_8;
  uVar6 = uVar11 * 4 + 0xf & 0xfffffffffffffff0;
  lVar5 = -uVar6;
  lVar2 = lVar5 + -0x1f0;
  *(undefined4 *)((long)&uStackY_1f0 - uVar6) = 0;
  if (1 < (int)uStack_8) {
    *(undefined8 *)((long)&uStackY_1f8 + lVar5) = 0x103b9f;
    memcpy((void *)((long)&uStackY_1f0 + lVar5 + 4),&stack0xfffffffffffffe44,
           (ulong)(uStack_8 - 1) << 2);
  }
  do {
    do {
    } while ((int)uStack_8 < 2);
    uVar6 = 0;
    iVar3 = -1;
    uVar7 = 1;
    do {
      iVar1 = *(int *)((long)&uStackY_1f0 + uVar7 * 4 + lVar2 + 0x1f0);
      if (iVar1 != 0 && iVar1 < iVar3) {
        iVar3 = iVar1;
        uVar6 = uVar7 & 0xffffffff;
      }
      *(undefined4 *)((long)&uStackY_1f0 + (long)(int)uVar6 * 4 + lVar2 + 0x1f0) = 0;
      uVar10 = 1;
      do {
        iVar1 = *(int *)((long)&uStackY_1f0 + uVar10 * 4 + lVar2 + 0x1f0);
        if ((iVar1 != 0) &&
           (*(int *)(&stack0xfffffffffffffe40 + uVar10 * 4 + (long)(int)uVar6 * 0x28) < iVar1)) {
          *(int *)((long)&uStackY_1f0 + uVar10 * 4 + lVar2 + 0x1f0) =
               *(int *)(&stack0xfffffffffffffe40 + uVar10 * 4 + (long)(int)uVar6 * 0x28);
        }
        uVar10 = uVar10 + 1;
      } while (uVar11 != uVar10);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar11);
  } while( true );
}

Assistant:

int dfs_traverse(m_graph g) {
        for (int i = 0; i < g.vnum; i++)
            visited[i] = 0;

        for (int j = 0; j < g.vnum; j++) {
            if (visited[j] == 0)
                dfs(g, j);
        }
    }